

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

string * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::DoCheckSol_abi_cxx11_
          (SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ArrayRef<double> *x,ValueMapDbl *duals,ArrayRef<double> *obj,
          ArrayRef<double> *x_raw,vector<double,_std::allocator<double>_> *x_back,
          bool if_recomp_vals)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ModelType *pMVar5;
  SolCheck *chk_00;
  VarInfoStatic *this_00;
  string *psVar6;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  byte in_stack_00000010;
  SolCheck chk;
  ArrayRef<double> *in_stack_fffffffffffffb88;
  SolCheck *chk_01;
  ArrayRef<double> *in_stack_fffffffffffffb90;
  SolCheck *this_01;
  undefined4 in_stack_fffffffffffffbec;
  uint uVar7;
  undefined1 in_stack_fffffffffffffccf;
  pointer in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  ArrayRef<mp::var::Type> *in_stack_fffffffffffffce0;
  ArrayRef<double> *in_stack_fffffffffffffce8;
  ArrayRef<double> *in_stack_fffffffffffffcf0;
  ValueMapDbl *in_stack_fffffffffffffcf8;
  ArrayRef<double> *in_stack_fffffffffffffd00;
  SolCheck *in_stack_fffffffffffffd08;
  ArrayRef<double> *in_stack_fffffffffffffd20;
  ArrayRef<double> *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd48;
  undefined1 in_stack_ffffffffffffff37;
  SolCheck *in_stack_ffffffffffffff38;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff40;
  
  ArrayRef<double>::ArrayRef(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  ArrayRef<double>::ArrayRef(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  ArrayRef<double>::ArrayRef(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  pMVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(in_RSI + -0x250));
  chk_00 = (SolCheck *)FlatModel<mp::DefaultFlatModelParams>::var_type_vec(pMVar5);
  ArrayRef<mp::var::Type>::ArrayRef
            ((ArrayRef<mp::var::Type> *)in_stack_fffffffffffffb90,
             (vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)in_stack_fffffffffffffb88);
  pMVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(in_RSI + -0x250));
  FlatModel<mp::DefaultFlatModelParams>::var_lb_vec(pMVar5);
  ArrayRef<double>::ArrayRef(in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->save_);
  pMVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(in_RSI + -0x250));
  FlatModel<mp::DefaultFlatModelParams>::var_ub_vec(pMVar5);
  ArrayRef<double>::ArrayRef(in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->save_);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::sol_feas_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)(in_RSI + -0x250));
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::sol_feas_tol_rel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)(in_RSI + -0x250));
  iVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::sol_round((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(in_RSI + -0x250));
  iVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::sol_prec((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)(in_RSI + -0x250));
  uVar7 = CONCAT13(in_stack_00000010,(int3)in_stack_fffffffffffffbec) & 0x1ffffff;
  if ((in_stack_00000010 & 1) == 0) {
    iVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::sol_check_mode((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)(in_RSI + -0x250));
  }
  else {
    iVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::sol_check_mode((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)(in_RSI + -0x250));
    iVar3 = iVar3 >> 5;
  }
  this_01 = (SolCheck *)&stack0xfffffffffffffc70;
  chk_01 = (SolCheck *)&stack0xfffffffffffffc98;
  SolCheck::SolCheck(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,
                     (double)in_stack_fffffffffffffcd8,(double)in_stack_fffffffffffffcd0,
                     in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
                     (bool)in_stack_fffffffffffffccf,in_stack_fffffffffffffd48);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15e8b0);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15e8bd);
  ArrayRef<mp::var::Type>::~ArrayRef((ArrayRef<mp::var::Type> *)0x15e8ca);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15e8d7);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15e8e4);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15e8f1);
  uVar4 = SolCheck::check_mode((SolCheck *)&stack0xfffffffffffffd70);
  if ((uVar4 & 1) != 0) {
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::CheckVars(in_RDX,chk_00);
  }
  uVar4 = SolCheck::check_mode((SolCheck *)&stack0xfffffffffffffd70);
  if ((uVar4 & 0xe) != 0) {
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::CheckCons((SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this_01,chk_01);
  }
  uVar4 = SolCheck::check_mode((SolCheck *)&stack0xfffffffffffffd70);
  if ((uVar4 & 0x10) != 0) {
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::CheckObjs((SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)CONCAT44(iVar1,iVar2),(SolCheck *)CONCAT44(uVar7,iVar3));
  }
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GenerateViolationsReport
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
  this_00 = SolCheck::x_ext((SolCheck *)&stack0xfffffffffffffd70);
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::get_x(this_00);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_RDX,
             (vector<double,_std::allocator<double>_> *)chk_00);
  psVar6 = SolCheck::GetReport_abi_cxx11_((SolCheck *)&stack0xfffffffffffffd70);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar6);
  SolCheck::~SolCheck(this_01);
  return in_RDI;
}

Assistant:

std::string DoCheckSol(
      ArrayRef<double> x,
      const pre::ValueMapDbl& duals,
      ArrayRef<double> obj,
      ArrayRef<double> x_raw,
      std::vector<double>& x_back,
      bool if_recomp_vals) {
    SolCheck chk(x, duals, obj, x_raw,
                 MPCD( GetModel() ).var_type_vec(),
                 MPCD( GetModel() ).var_lb_vec(),
                 MPCD( GetModel() ).var_ub_vec(),
                 MPCD( sol_feas_tol() ),
                 MPCD( sol_feas_tol_rel() ),
                 MPCD( sol_round() ),
                 MPCD( sol_prec() ),
                 if_recomp_vals,
                 if_recomp_vals
                 ? (MPCD( sol_check_mode() ) >> 5)
                 : (MPCD( sol_check_mode() )));  // for raw values
    if (chk.check_mode() & 1)
      CheckVars(chk);
    if (chk.check_mode() & (2+4+8))
      CheckCons(chk);
    if (chk.check_mode() & 16)
      CheckObjs(chk);
    MPD( GenerateViolationsReport(chk, if_recomp_vals) );
    x_back = std::move(chk.x_ext().get_x()); // to reuse 'realistic' vector
    return chk.GetReport();
  }